

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  CommentInfo *pCVar1;
  ptrdiff_t pVar2;
  
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfe00;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  swapPayload(this,other);
  pCVar1 = this->comments_;
  this->comments_ = other->comments_;
  other->comments_ = pCVar1;
  pVar2 = this->start_;
  this->start_ = other->start_;
  other->start_ = pVar2;
  pVar2 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = pVar2;
  return;
}

Assistant:

Value::Value(Value&& other) {
  initBasic(nullValue);
  swap(other);
}